

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmpack.cpp
# Opt level: O3

void CVmPack::unpack_iter_item
               (CVmPackPos *p,CVmObjList *retlst,int *retcnt,CVmPackGroup *group,int *prefix_count)

{
  CVmDataSource *src;
  bool bVar1;
  int iVar2;
  int iVar3;
  wchar_t wVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  _func_int *UNRECOVERED_JUMPTABLE;
  undefined4 extraout_var_06;
  long lVar5;
  byte *pbVar6;
  uint uVar7;
  CVmPackGroup *pCVar8;
  utf8_ptr uVar9;
  ulong uVar10;
  byte *pbVar11;
  CVmPackPos p_1;
  CVmPackType t;
  CVmPackPos local_98;
  CVmPackType local_80;
  
  local_80.lit.idx = 0;
  local_80.lit.p.p_ = (char *)0x0;
  local_80.lit.len = 0;
  local_80.type_code = L'\0';
  local_80.big_endian = 0;
  local_80.count = 0xffffffff;
  local_80.count_in_bytes = 0;
  local_80.count_as_type = L'\0';
  local_80.up_to_count = 0;
  local_80.bang = 0;
  local_80.tilde = 0;
  local_80.pct = 0;
  local_80.qu = 0;
  local_80.null_term = 0;
  local_80.fmtidx = 0;
  parse_type(p,&local_80,group);
  iVar2 = local_80.count;
  src = group->ds;
  bVar1 = true;
  if (local_80.type_code < L'a') {
    if (local_80.type_code < L'H') {
      if (local_80.type_code != L'\"') {
        if (local_80.type_code == L'@') {
          if (local_80.qu == 0) {
            pCVar8 = group;
            if (local_80.bang != 0) {
              do {
                group = pCVar8;
                pCVar8 = group->parent;
              } while (group->parent != (CVmPackGroup *)0x0);
            }
            uVar7 = local_80.count;
            if (local_80.count < 0) {
              uVar7 = 1;
            }
            lVar5 = group->stream_ofs;
            iVar2 = (*src->_vptr_CVmDataSource[7])(src);
            lVar5 = ((int)uVar7 + lVar5) - CONCAT44(extraout_var_06,iVar2);
            UNRECOVERED_JUMPTABLE = src->_vptr_CVmDataSource[8];
            goto LAB_0027756a;
          }
          goto LAB_002774d0;
        }
        if (local_80.type_code == L'A') goto switchD_002771cd_caseD_75;
        goto switchD_002771cd_caseD_76;
      }
      if ((byte *)local_80.lit.len == (byte *)0x0) {
        iVar2 = 0;
      }
      else {
        uVar9.p_ = local_80.lit.p.p_;
        pbVar11 = (byte *)local_80.lit.len;
        iVar3 = 1;
        do {
          iVar2 = iVar3;
          wVar4 = utf8_ptr::s_getch(uVar9.p_);
          pbVar6 = (byte *)uVar9.p_;
          if (wVar4 == L'\"') {
            pbVar11 = (byte *)uVar9.p_ +
                      ((long)pbVar11 -
                      (long)((byte *)uVar9.p_ +
                            (ulong)((((byte)*uVar9.p_ >> 5 & 1) != 0) + 1 &
                                   (uint)((byte)*uVar9.p_ >> 7) * 3) + 1));
            pbVar6 = (byte *)uVar9.p_ +
                     (ulong)((((byte)*uVar9.p_ >> 5 & 1) != 0) + 1 &
                            (uint)((byte)*uVar9.p_ >> 7) * 3) + 1;
            if (pbVar11 == (byte *)0x0) break;
          }
          uVar9.p_ = (char *)(pbVar6 + (ulong)(((*pbVar6 >> 5 & 1) != 0) + 1 &
                                              (uint)(*pbVar6 >> 7) * 3) + 1);
          pbVar11 = pbVar6 + ((long)pbVar11 - (long)uVar9.p_);
          iVar3 = iVar2 + 1;
        } while (pbVar11 != (byte *)0x0);
      }
      uVar7 = local_80.count;
      if (local_80.count < 0) {
        uVar7 = 1;
      }
      lVar5 = (long)(int)(uVar7 * iVar2);
LAB_00277560:
      UNRECOVERED_JUMPTABLE = src->_vptr_CVmDataSource[8];
LAB_0027756a:
      (*UNRECOVERED_JUMPTABLE)(src,lVar5,1);
      return;
    }
    if (local_80.type_code < L'W') {
      if ((local_80.type_code == L'H') || (local_80.type_code == L'U'))
      goto switchD_002771cd_caseD_75;
    }
    else {
      if (local_80.type_code == L'W') goto switchD_002771cd_caseD_75;
      if (local_80.type_code == L'X') {
        uVar10 = (ulong)(uint)local_80.count;
        if (local_80.bang != 0) {
          if (1 < local_80.count) {
            iVar2 = (*src->_vptr_CVmDataSource[7])(src);
            do {
              pCVar8 = group;
              group = pCVar8->parent;
            } while (group != (CVmPackGroup *)0x0);
            lVar5 = (CONCAT44(extraout_var_00,iVar2) - pCVar8->stream_ofs) % (long)uVar10;
            if (lVar5 != 0) {
              lVar5 = (long)-(int)lVar5;
              goto LAB_00277560;
            }
          }
          goto LAB_00277524;
        }
        uVar7 = local_80.count;
        if (local_80.count < 0) {
          uVar7 = 1;
        }
        uVar7 = -uVar7;
        goto LAB_0027755d;
      }
    }
  }
  else {
    switch(local_80.type_code) {
    case L'u':
    case L'w':
switchD_002771cd_caseD_75:
      bVar1 = false;
      break;
    case L'v':
    case L'y':
    case L'z':
      break;
    case L'x':
      uVar10 = (ulong)(uint)local_80.count;
      if (local_80.bang == 0) {
        uVar7 = local_80.count;
        if (local_80.count < 0) {
          uVar7 = 1;
        }
LAB_0027755d:
        lVar5 = (long)(int)uVar7;
      }
      else {
        if (1 < local_80.count) {
          iVar3 = (*src->_vptr_CVmDataSource[7])(src);
          do {
            pCVar8 = group;
            group = pCVar8->parent;
          } while (group != (CVmPackGroup *)0x0);
          lVar5 = (CONCAT44(extraout_var,iVar3) - pCVar8->stream_ofs) % (long)uVar10;
          if (lVar5 != 0) {
            uVar7 = iVar2 - (int)lVar5;
            goto LAB_0027755d;
          }
        }
LAB_00277524:
        lVar5 = 0;
      }
      goto LAB_00277560;
    case L'{':
      local_98.p.p_ = local_80.lit.p.p_;
      local_98.len = local_80.lit.len;
      local_98.idx = local_80.lit.idx;
      CVmPackPos::getch(&local_98);
      iVar2 = 0;
      while ((byte *)local_98.len != (byte *)0x0) {
        pbVar6 = (byte *)local_98.p.p_ +
                 (ulong)((((byte)*local_98.p.p_ >> 5 & 1) != 0) + 1 &
                        (uint)((byte)*local_98.p.p_ >> 7) * 3) + 1;
        uVar9.p_ = (char *)pbVar6;
        pbVar11 = (byte *)local_98.p.p_ + (local_98.len - (long)pbVar6);
        iVar3 = local_98.idx + 1;
        if ((byte *)local_98.p.p_ + (local_98.len - (long)pbVar6) != (byte *)0x0) {
          uVar9.p_ = (char *)(pbVar6 + (ulong)(((*pbVar6 >> 5 & 1) != 0) + 1 &
                                              (uint)(*pbVar6 >> 7) * 3) + 1);
          pbVar11 = (byte *)local_98.p.p_ +
                    (local_98.len -
                    (long)(pbVar6 + (ulong)(((*pbVar6 >> 5 & 1) != 0) + 1 & (uint)(*pbVar6 >> 7) * 3
                                           ) + 1));
          iVar3 = local_98.idx + 2;
        }
        local_98.idx = iVar3;
        local_98.len = (size_t)pbVar11;
        local_98.p.p_ = uVar9.p_;
        CVmPackPos::getch(&local_98);
        iVar2 = iVar2 + 1;
      }
      uVar7 = local_80.count;
      if (local_80.count < 0) {
        uVar7 = 1;
      }
      (*src->_vptr_CVmDataSource[8])(src,(long)(int)(uVar7 * iVar2),1);
      return;
    default:
      if (((uint)(local_80.type_code + L'\xffffff9f') < 2) || (local_80.type_code == L'h'))
      goto switchD_002771cd_caseD_75;
    }
  }
switchD_002771cd_caseD_76:
  if (prefix_count != (int *)0x0) {
    local_80.count = *prefix_count;
  }
  iVar2 = local_80.count;
  if (bVar1) {
    if (local_80.count == 0xfffffffe) {
      iVar2 = (*src->_vptr_CVmDataSource[6])(src);
      iVar3 = (*src->_vptr_CVmDataSource[7])(src);
      if (CONCAT44(extraout_var_01,iVar2) <= CONCAT44(extraout_var_02,iVar3)) {
        return;
      }
      do {
        unpack_into_list(retlst,retcnt,src,&local_80,group);
        iVar3 = (*src->_vptr_CVmDataSource[7])(src);
      } while (CONCAT44(extraout_var_03,iVar3) < CONCAT44(extraout_var_01,iVar2));
      return;
    }
    if (local_80.up_to_count != 0) {
      iVar3 = (*src->_vptr_CVmDataSource[6])(src);
      uVar7 = 1;
      if (-1 < iVar2) {
        uVar7 = iVar2;
      }
      if ((int)uVar7 < 1) {
        return;
      }
      do {
        iVar2 = (*src->_vptr_CVmDataSource[7])(src);
        if (CONCAT44(extraout_var_04,iVar3) <= CONCAT44(extraout_var_05,iVar2)) {
          return;
        }
        unpack_into_list(retlst,retcnt,src,&local_80,group);
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
      return;
    }
    uVar7 = 1;
    if (-1 < local_80.count) {
      uVar7 = local_80.count;
    }
    if ((int)uVar7 < 1) {
      return;
    }
    do {
      unpack_into_list(retlst,retcnt,src,&local_80,group);
      uVar7 = uVar7 - 1;
    } while (uVar7 != 0);
    return;
  }
LAB_002774d0:
  unpack_into_list(retlst,retcnt,src,&local_80,group);
  return;
}

Assistant:

void CVmPack::unpack_iter_item(VMG_ CVmPackPos *p,
                               CVmObjList *retlst, int &retcnt,
                               CVmPackGroup *group, const int *prefix_count)
{
    int len;
    
    /* parse the template item */
    CVmPackType t;
    parse_type(p, &t, group);

    /* get the data source */
    CVmDataSource *src = group->ds;

    /* check for non-value types and string types */
    int is_string_type = FALSE;
    switch (t.type_code)
    {
    case 'x':
        /* Nul bytes: on input, just skip bytes */
        if (t.bang)
            src->seek(alignment_padding(&t, group, 1), OSFSK_CUR);
        else
            src->seek(t.get_count(), OSFSK_CUR);
        return;

    case 'X':
        /* back up by 'count' bytes */
        if (t.bang)
            src->seek(alignment_padding(&t, group, -1), OSFSK_CUR);
        else
            src->seek(-t.get_count(), OSFSK_CUR);
        return;

    case '"':
        /* count the characters in the string */
        len = 0;
        for (CVmPackPos p(&t.lit) ; p.len != 0 ; p.inc(), ++len)
        {
            /* if this is a quote, it must be stuttered, so skip it */
            if (p.getch_raw() == '"')
                p.inc();
        }

        /* skip the bytes, and we're done */
        src->seek(len * t.get_count(), OSFSK_CUR);
        return;

    case '{':
        /* count the hex digit pairs */
        len = 0;
        for (CVmPackPos p(&t.lit) ; p.more() ; ++len, p.inc(), p.inc()) ;

        /* skip the bytes, and we're done */
        src->seek(len * t.get_count(), OSFSK_CUR);
        return;

    case '@':
        /* seek to position or retrieve current position */
        if (t.qu)
        {
            /* @? retrieves the current position as an output value */
            unpack_into_list(vmg_ retlst, retcnt, src, &t, group);
        }
        else
        {
            /* 
             *   Absolute positioning: seek to the starting position plus the
             *   specified offset.  The starting position is the current
             *   group's starting position, or the whole string's start if
             *   the !  qualifier is present.  
             */
            src->seek((t.bang ? group->root_stream_ofs() : group->stream_ofs)
                      + t.get_count() - src->get_pos(),
                      OSFSK_CUR);
        }
        return;

    case 'a':
    case 'A':
    case 'b':
    case 'u':
    case 'U':
    case 'w':
    case 'W':
    case 'h':
    case 'H':
        /* make a note that this is a string type */
        is_string_type = TRUE;
        break;
    }

    /*
     *   We have a regular unpacking type (not one of the special positioning
     *   codes).  If there's a prefix count, it overrides any count specified
     *   in the type.  
     */
    if (prefix_count != 0)
        t.count = *prefix_count;

    /* 
     *   If it's a string type, the repeat count specifies the length of the
     *   string in the file (in bytes, characters, nibbles, or other units
     *   that vary by template type).  Otherwise, the repeat count is the
     *   number of copies of the item to unpack.  
     */
    if (is_string_type)
    {
        /* 
         *   It's a string type.  The count doesn't specify the number of
         *   strings to write, but rather specifies the number of bytes to
         *   read into one string.  
         */
        unpack_into_list(vmg_ retlst, retcnt, src, &t, group);
    }
    else if (t.count == ITER_STAR)
    {
        /* unpack this item repeatedly until we run out of source */
        long src_size = src->get_size();
        while (src->get_pos() < src_size)
            unpack_into_list(vmg_ retlst, retcnt, src, &t, group);
    }
    else if (t.up_to_count)
    {
        /* 
         *   unpack this item the number of times given by the repeat count,
         *   but stop if we reach EOF first
         */
        long src_size = src->get_size();
        for (int i = 0 ; i < t.get_count() && src->get_pos() < src_size ; ++i)
            unpack_into_list(vmg_ retlst, retcnt, src, &t, group);
    }
    else
    {
        /* unpack this item the number of times given by the repeat count */
        for (int i = 0 ; i < t.get_count() ; ++i)
            unpack_into_list(vmg_ retlst, retcnt, src, &t, group);
    }
}